

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(long *param_1,undefined8 param_2,long *param_3)

{
  undefined4 local_1c;
  
  param_1 = (long *)*param_1;
  if (param_1 != (long *)0x0) {
    do {
      local_1c = (undefined4)param_1[1];
      std::ostream::write((char *)(*param_3 + 0x10),(long)&local_1c);
      param_1 = (long *)*param_1;
    } while (param_1 != (long *)0x0);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }